

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O3

void __thiscall Js::ConfigFlagsTable::FlagSetCallback_ES6All(ConfigFlagsTable *this,Boolean value)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  int iVar5;
  
  uVar4 = CONCAT71(in_register_00000031,value) & 0xffffffff;
  uVar1 = 0x75;
  do {
    do {
      iVar5 = (int)(uVar1 & 0xffff);
      if (iVar5 != 0x97) {
        if (iVar5 == 0x1d7) {
          return;
        }
        Output::VerboseNote(L"FLAG %s = %d - setting child flag %s = %d\n",L"ES6",uVar4,
                            (&FlagNames)[uVar1 & 0xffff],
                            CONCAT71(in_register_00000031,value) & 0xffffffff);
        SetAsBoolean(this,(Flag)uVar1,SUB81(uVar4,0));
      }
      uVar2 = iVar5 + 1;
      if ((ushort)((Flag)uVar1 - InvalidFlag) < 2) {
        uVar2 = 0;
      }
      uVar1 = 0x1d7;
    } while (0x1d5 < uVar2);
    uVar3 = (ulong)uVar2;
    do {
      if (uVar3 - 0x75 < 0x25) {
        uVar1 = uVar3 & 0xffffffff;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x1d6);
  } while( true );
}

Assistant:

void
    ConfigFlagsTable::FlagSetCallback_ES6All(Boolean value)
    {
        // iterate through all ES6 flags - and set them explicitly (except ES6Verbose)
        Flag parentFlag = ES6Flag;

        // parent ES6 flag, will iterate through all child ES6 flags
        Flag childFlag = GetNextChildFlag(parentFlag, /* no currentChildFlag */ InvalidFlag);
        while (childFlag != InvalidFlag)
        {
            // skip verbose
            if (childFlag != ES6VerboseFlag)
            {
                Boolean childValue = value;

                Output::VerboseNote(_u("FLAG %s = %d - setting child flag %s = %d\n"), FlagNames[(int) parentFlag], value, FlagNames[(int) childFlag], childValue);
                this->SetAsBoolean(childFlag, childValue);
            }

            // get next child flag
            childFlag = GetNextChildFlag(parentFlag, /* currentChildFlag */ childFlag);
        }
    }